

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

u_char * ngx_utf8_cpystrn(u_char *dst,u_char *src,size_t n,size_t len)

{
  u_char uVar1;
  uint32_t uVar2;
  long lVar3;
  u_char *local_38;
  u_char *next;
  
  if (n != 0) {
    lVar3 = n - 1;
    if (lVar3 != 0) {
      do {
        uVar1 = *src;
        *dst = uVar1;
        if ((char)uVar1 < '\0') {
          local_38 = src;
          uVar2 = ngx_utf8_decode(&local_38,len);
          if (0x10ffff < uVar2) break;
          for (; src < local_38; src = src + 1) {
            *dst = *src;
            dst = dst + 1;
            len = len - 1;
          }
        }
        else {
          if (uVar1 == '\0') {
            return dst;
          }
          dst = dst + 1;
          src = src + 1;
          len = len - 1;
        }
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    *dst = '\0';
  }
  return dst;
}

Assistant:

u_char *
ngx_utf8_cpystrn(u_char *dst, u_char *src, size_t n, size_t len)
{
    u_char  c, *next;

    if (n == 0) {
        return dst;
    }

    while (--n) {

        c = *src;
        *dst = c;

        if (c < 0x80) {

            if (c != '\0') {
                dst++;
                src++;
                len--;

                continue;
            }

            return dst;
        }

        next = src;

        if (ngx_utf8_decode(&next, len) > 0x10ffff) {
            /* invalid UTF-8 */
            break;
        }

        while (src < next) {
            *dst++ = *src++;
            len--;
        }
    }

    *dst = '\0';

    return dst;
}